

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_Chase(Task *__return_storage_ptr__,TaskDatabase *tasks)

{
  mapped_type *pmVar1;
  key_type local_118c;
  string local_1188;
  Task chaseSight;
  Task chasePosition;
  Task local_a78;
  Task local_700;
  Task chaseHeading;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1188,"chase",(allocator<char> *)&chaseSight);
  Task::Task(__return_storage_ptr__,&local_1188,Abstract);
  std::__cxx11::string::~string((string *)&local_1188);
  __return_storage_ptr__->identifier = Chase;
  create_ChaseSight();
  create_ChaseLastKnownPosition();
  create_ChaseLastKnownHeading();
  Task::Task(&local_700,&chaseSight);
  TaskDatabase::addTask(tasks,ChaseSight,&local_700);
  Task::~Task(&local_700);
  Task::Task(&local_a78,&chasePosition);
  TaskDatabase::addTask(tasks,ChaseLastKnownPosition,&local_a78);
  Task::~Task(&local_a78);
  local_118c = Chase;
  pmVar1 = std::
           map<AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>_>_>
           ::operator[](&tasks->abstractTaskImplementations,&local_118c);
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(pmVar1,&chaseSight);
  local_118c = Chase;
  pmVar1 = std::
           map<AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>,_std::less<AI::TaskIdentifier>,_std::allocator<std::pair<const_AI::TaskIdentifier,_std::vector<AI::Task,_std::allocator<AI::Task>_>_>_>_>
           ::operator[](&tasks->abstractTaskImplementations,&local_118c);
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(pmVar1,&chasePosition);
  Task::~Task(&chaseHeading);
  Task::~Task(&chasePosition);
  Task::~Task(&chaseSight);
  return __return_storage_ptr__;
}

Assistant:

Task create_Chase(TaskDatabase& tasks)
	{
		Task chase {"chase", TaskType::Abstract};
		chase.identifier = TaskIdentifier::Chase;

		auto chaseSight = create_ChaseSight();
		auto chasePosition = create_ChaseLastKnownPosition();
		auto chaseHeading = create_ChaseLastKnownHeading();

		tasks.addTask(TaskIdentifier::ChaseSight, chaseSight);
		tasks.addTask(TaskIdentifier::ChaseLastKnownPosition, chasePosition);
		//tasks.addTask(TaskIdentifier::ChaseLastKnownHeading, chaseHeading);

		tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chaseSight);
		tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chasePosition);
		//tasks.abstractTaskImplementations[TaskIdentifier::Chase].push_back(chaseHeading);

		return chase;		
	}